

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execCmpiEa<(moira::Instr)39,(moira::Mode)2,(moira::Size)4>(Moira *this,u16 opcode)

{
  ushort uVar1;
  u16 uVar2;
  bool bVar3;
  u32 uVar4;
  ulong in_RAX;
  long lVar5;
  u32 data;
  u32 ea;
  undefined8 local_28;
  
  uVar1 = (this->queue).irc;
  local_28 = in_RAX;
  readExt(this);
  uVar2 = (this->queue).irc;
  readExt(this);
  bVar3 = readOp<(moira::Mode)2,(moira::Size)4,0ul>
                    (this,opcode & 7,(u32 *)((long)&local_28 + 4),(u32 *)&local_28);
  if (bVar3) {
    uVar4 = (this->reg).pc;
    (this->reg).pc0 = uVar4;
    (this->queue).ird = (this->queue).irc;
    uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar4 + 2);
    (this->queue).irc = (u16)uVar4;
    lVar5 = (local_28 & 0xffffffff) - (ulong)CONCAT22(uVar1,uVar2);
    (this->reg).sr.c = (bool)((byte)((ulong)lVar5 >> 0x20) & 1);
    (this->reg).sr.v =
         (int)(((uint)lVar5 ^ (uint)local_28) & ((uint)uVar1 << 0x10 ^ (uint)local_28)) < 0;
    (this->reg).sr.z = (uint)lVar5 == 0;
    (this->reg).sr.n = (bool)((byte)((ulong)lVar5 >> 0x18) >> 7);
  }
  return;
}

Assistant:

void
Moira::execCmpiEa(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;
    prefetch();

    cmp<S>(src, data);
}